

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.hpp
# Opt level: O2

OpenMDBitSet * __thiscall OpenMD::OpenMDBitSet::operator-=(OpenMDBitSet *this,OpenMDBitSet *bs)

{
  OpenMDBitSet tmp;
  _Bvector_base<std::allocator<bool>_> _Stack_38;
  
  operator^((OpenMDBitSet *)&_Stack_38,this,bs);
  andOperator(this,(OpenMDBitSet *)&_Stack_38);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&_Stack_38);
  return this;
}

Assistant:

OpenMDBitSet& operator-=(const OpenMDBitSet& bs) {
      OpenMDBitSet tmp = *this ^ bs;
      *this &= tmp;
      return *this;
    }